

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QString,_QHashDummyValue>::emplace<QHashDummyValue>
          (QHash<QString,_QHashDummyValue> *this,QString *key,QHashDummyValue *args)

{
  Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *pDVar1;
  Data *pDVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QHash<QString,_QHashDummyValue> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = this->d;
  if (pDVar2 == (Data *)0x0) {
    local_28.d = (Data *)0x0;
LAB_0021a673:
    pDVar2 = (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0;
LAB_0021a694:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<QString,_QHashDummyValue>_>::detached(pDVar2);
    this->d = pDVar1;
  }
  else {
    if ((uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i < 2) {
      if (pDVar2->size < pDVar2->numBuckets >> 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar3 = (piter)emplace_helper<QHashDummyValue>(this,key,args);
          return (iterator)pVar3;
        }
      }
      else {
        pVar3 = (piter)emplace_helper<QHashDummyValue>(this,key,(QHashDummyValue *)&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar3;
        }
      }
      goto LAB_0021a6f6;
    }
    local_28.d = pDVar2;
    if ((pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pDVar2 = this->d;
      if (pDVar2 == (Data *)0x0) goto LAB_0021a673;
    }
    if (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_0021a694;
  }
  pVar3 = (piter)emplace_helper<QHashDummyValue>(this,key,args);
  ~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_0021a6f6:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }